

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.cpp
# Opt level: O0

String * __thiscall
Rml::Style::ComputedValues::cursor_abi_cxx11_(String *__return_storage_ptr__,ComputedValues *this)

{
  Property *this_00;
  Property *p;
  ComputedValues *this_local;
  
  this_00 = Element::GetProperty(this->element,Cursor);
  if (this_00 == (Property *)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    Property::Get<std::__cxx11::string>(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

String Style::ComputedValues::cursor() const
{
	if (auto p = element->GetProperty(PropertyId::Cursor))
		return p->Get<String>();

	return String();
}